

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.hpp
# Opt level: O2

int ixy::IxgbeDevice::init(EVP_PKEY_CTX *ctx)

{
  __uid_t _Var1;
  ushort in_CX;
  ushort in_DX;
  string *in_RSI;
  pair<unsigned_char_*,_unsigned_long> pVar2;
  uint16_t num_tx_queues_local;
  uint16_t num_rx_queues_local;
  vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> tx_queues;
  vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> rx_queues;
  string local_f0;
  vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> local_d0;
  IxgbeDevice dev;
  vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> local_48;
  
  num_tx_queues_local = in_CX;
  num_rx_queues_local = in_DX;
  _Var1 = getuid();
  if (_Var1 != 0) {
    dev.pci_addr._M_dataplus._M_p = "not running as root, this will probably fail";
    warn<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.hpp"
               ,0x2e,"init",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&dev);
  }
  if (0x40 < in_DX) {
    dev.pci_addr._M_dataplus._M_p = "cannot configure ";
    dev.pci_addr._M_string_length = (size_type)&num_rx_queues_local;
    dev.pci_addr.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_10980;
    dev.pci_addr.field_2._8_8_ = &MAX_QUEUES;
    error<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.hpp"
               ,0x32,"init",
               (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>,_const_unsigned_int_&>_>
                *)&dev);
  }
  if (0x40 < in_CX) {
    dev.pci_addr._M_dataplus._M_p = "cannot configure ";
    dev.pci_addr._M_string_length = (size_type)&num_tx_queues_local;
    dev.pci_addr.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_10999;
    dev.pci_addr.field_2._8_8_ = &MAX_QUEUES;
    error<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.hpp"
               ,0x36,"init",
               (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>,_const_unsigned_int_&>_>
                *)&dev);
  }
  rx_queues.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rx_queues.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rx_queues.super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tx_queues.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tx_queues.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tx_queues.super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::reserve
            (&rx_queues,(ulong)num_rx_queues_local);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::reserve
            (&tx_queues,(ulong)num_tx_queues_local);
  pVar2 = pci_map_resource(in_RSI);
  std::__cxx11::string::string((string *)&local_f0,(string *)in_RSI);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::vector
            (&local_d0,&rx_queues);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::vector
            (&local_48,&tx_queues);
  IxgbeDevice(&dev,&local_f0,pVar2.first,pVar2.second,num_rx_queues_local,num_tx_queues_local,
              &local_d0,&local_48);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::~vector(&local_48);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::~vector(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  reset_and_init(&dev);
  std::make_unique<ixy::IxgbeDevice,ixy::IxgbeDevice>((IxgbeDevice *)ctx);
  ~IxgbeDevice(&dev);
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::~vector(&tx_queues);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::~vector(&rx_queues);
  return (int)ctx;
}

Assistant:

static auto
    init(const std::string &pci_addr, uint16_t num_rx_queues,
         uint16_t num_tx_queues) -> std::unique_ptr<IxgbeDevice> {
        if (getuid()) {
            warn("not running as root, this will probably fail");
        }

        if (num_rx_queues > MAX_QUEUES) {
            error("cannot configure " << num_rx_queues << " rx queues: limit is " << MAX_QUEUES);
        }

        if (num_tx_queues > MAX_QUEUES) {
            error("cannot configure " << num_tx_queues << " tx queues: limit is " << MAX_QUEUES);
        }

        std::vector<ixgbe_rx_queue> rx_queues;
        std::vector<ixgbe_tx_queue> tx_queues;

        rx_queues.reserve(num_rx_queues);
        tx_queues.reserve(num_tx_queues);

        auto mapped_region = pci_map_resource(pci_addr);

        auto addr = mapped_region.first;
        auto len = mapped_region.second;

        auto dev = IxgbeDevice{pci_addr, addr, len, num_rx_queues, num_tx_queues, rx_queues, tx_queues};

        dev.reset_and_init();

        return std::make_unique<IxgbeDevice>(std::move(dev));
    }